

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O1

bucket * lookup(char *name)

{
  bucket **ppbVar1;
  int iVar2;
  bucket *pbVar3;
  bucket *pbVar4;
  
  ppbVar1 = symbol_table;
  iVar2 = hash(name);
  pbVar4 = (bucket *)(ppbVar1 + iVar2);
  do {
    pbVar3 = pbVar4->link;
    if (pbVar3 == (bucket *)0x0) {
      pbVar3 = make_bucket(name);
      pbVar4->link = pbVar3;
      last_symbol->next = pbVar3;
      last_symbol = pbVar3;
      return pbVar3;
    }
    iVar2 = strcmp(name,pbVar3->name);
    pbVar4 = pbVar3;
  } while (iVar2 != 0);
  return pbVar3;
}

Assistant:

bucket *lookup(char *name)
{
    register bucket *bp, **bpp;

    bpp = symbol_table + hash(name);
    bp = *bpp;

    while (bp)
    {
	if (strcmp(name, bp->name) == 0) return (bp);
	bpp = &bp->link;
	bp = *bpp;
    }

    *bpp = bp = make_bucket(name);
    last_symbol->next = bp;
    last_symbol = bp;

    return (bp);
}